

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_set_svc_seq_params(AV1_PRIMARY *ppi)

{
  uint tl;
  uint sl;
  int i;
  SequenceHeader *seq;
  AV1_PRIMARY *ppi_local;
  
  if ((ppi->seq_params).operating_points_cnt_minus_1 == 0) {
    (ppi->seq_params).operating_point_idc[0] = 0;
    (ppi->seq_params).has_nonzero_operating_point_idc = false;
  }
  else {
    i = 0;
    for (sl = 0; sl < ppi->number_spatial_layers; sl = sl + 1) {
      for (tl = 0; tl < ppi->number_temporal_layers; tl = tl + 1) {
        (ppi->seq_params).operating_point_idc[i] =
             (-1 << ((char)ppi->number_spatial_layers - (char)sl & 0x1fU) ^ 0xffffffffU) << 8 |
             -1 << ((char)ppi->number_temporal_layers - (char)tl & 0x1fU) ^ 0xffffffffU;
        i = i + 1;
      }
    }
    (ppi->seq_params).has_nonzero_operating_point_idc = true;
  }
  return;
}

Assistant:

void av1_set_svc_seq_params(AV1_PRIMARY *const ppi) {
  SequenceHeader *const seq = &ppi->seq_params;
  if (seq->operating_points_cnt_minus_1 == 0) {
    seq->operating_point_idc[0] = 0;
    seq->has_nonzero_operating_point_idc = false;
  } else {
    // Set operating_point_idc[] such that the i=0 point corresponds to the
    // highest quality operating point (all layers), and subsequent
    // operarting points (i > 0) are lower quality corresponding to
    // skip decoding enhancement  layers (temporal first).
    int i = 0;
    assert(seq->operating_points_cnt_minus_1 ==
           (int)(ppi->number_spatial_layers * ppi->number_temporal_layers - 1));
    for (unsigned int sl = 0; sl < ppi->number_spatial_layers; sl++) {
      for (unsigned int tl = 0; tl < ppi->number_temporal_layers; tl++) {
        seq->operating_point_idc[i] =
            (~(~0u << (ppi->number_spatial_layers - sl)) << 8) |
            ~(~0u << (ppi->number_temporal_layers - tl));
        assert(seq->operating_point_idc[i] != 0);
        i++;
      }
    }
    seq->has_nonzero_operating_point_idc = true;
  }
}